

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepFaceArray::Write(ON_BrepFaceArray *this,ON_BinaryArchive *file)

{
  ON_BrepFace *pOVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_38;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_34;
  
  bVar5 = false;
  bVar3 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (bVar3) {
    iVar6 = ON_BinaryArchive::Archive3dmVersion(file);
    bVar3 = ON_BinaryArchive::Write3dmChunkVersion(file,1,(0x45 < iVar6) + 1);
    uVar7 = (this->super_ON_ObjectArray<ON_BrepFace>).super_ON_ClassArray<ON_BrepFace>.m_count;
    lVar13 = (long)(int)uVar7;
    if (bVar3) {
      bVar4 = ON_BinaryArchive::WriteInt(file,uVar7);
    }
    else {
      bVar4 = false;
    }
    lVar12 = 0;
    for (lVar11 = 0; ((bVar4 & 1) != 0 && (lVar11 < lVar13)); lVar11 = lVar11 + 1) {
      pOVar1 = (this->super_ON_ObjectArray<ON_BrepFace>).super_ON_ClassArray<ON_BrepFace>.m_a;
      bVar4 = (**(code **)(*(long *)((pOVar1->m_face_uuid).Data4 + lVar12 + -0x5c) + 0x50))
                        ((pOVar1->m_face_uuid).Data4 + lVar12 + -0x5c,file);
      lVar12 = lVar12 + 0xd8;
    }
    lVar11 = 0x54;
    for (lVar12 = 0; ((bVar4 & 1) != 0 && (lVar12 < lVar13)); lVar12 = lVar12 + 1) {
      bVar4 = ON_BinaryArchive::WriteUuid
                        (file,(ON_UUID *)
                              ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                 super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                              lVar11 + -0x5c));
      lVar11 = lVar11 + 0xd8;
    }
    if ((~bVar4 & 1) == 0 && 0x45 < iVar6) {
      lVar11 = 0;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      uVar2 = 0;
      do {
        uVar10 = uVar2;
        if (uVar9 == uVar10) break;
        uVar7 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
        local_34 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                   ON_BrepFace::PerFaceColor
                             ((ON_BrepFace *)
                              ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                 super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                              lVar11 + -0x5c));
        uVar8 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_34);
        lVar11 = lVar11 + 0xd8;
        uVar2 = uVar10 + 1;
      } while (uVar7 == uVar8);
      bVar4 = ON_BinaryArchive::WriteBool(file,(long)uVar10 < lVar13);
      if ((long)uVar10 < lVar13 && (bool)bVar4) {
        lVar12 = 0;
        for (lVar11 = 0; ((bool)bVar4 != false && (lVar11 < lVar13)); lVar11 = lVar11 + 1) {
          local_38 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                     ON_BrepFace::PerFaceColor
                               ((ON_BrepFace *)
                                ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                   super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                lVar12 + -0x5c));
          bVar4 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&local_38);
          lVar12 = lVar12 + 0xd8;
        }
      }
    }
    bVar5 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar5 = (bool)(bVar5 & bVar4);
  }
  return bVar5;
}

Assistant:

bool ON_BrepFaceArray::Write( ON_BinaryArchive& file ) const
{
  int i;
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) 
  {
    // 1.1 added m_face_uuid
    // 1.2 added m_per_face_color
    const int minor_version = file.Archive3dmVersion() >= 70 ? 2 : 1;
    rc = file.Write3dmChunkVersion(1, minor_version);

    // chunk version 1.0 and later
    const int count = Count();
    if (rc) rc = file.WriteInt( count );
    for ( i = 0; rc && i < count; i++ ) 
    {
      if (rc) rc = m_a[i].Write(file);
    }

    // chunk version 1.1 and later
    for ( i = 0; rc && i < count; i++ )
    {
      rc = file.WriteUuid( m_a[i].m_face_uuid );
    }

    if (rc && minor_version >= 2)
    {
      // 1.2 added optional per face colors
      bool bHavePerFaceColors = false;
      for (i = 0; rc && i < count; i++)
      {
        if (ON_Color::UnsetColor != m_a[i].PerFaceColor())
        {
          bHavePerFaceColors = true;
          break;
        }
      }

      rc = file.WriteBool(bHavePerFaceColors);
      if (rc && bHavePerFaceColors)
      {
        for (i = 0; rc && i < count; i++)
          rc = file.WriteColor(m_a[i].PerFaceColor());
      }
    }

    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}